

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

hrgls_Status hrgls_MessageGetValue(hrgls_Message obj,char **val)

{
  if (obj == (hrgls_Message)0x0) {
    return 0x3ee;
  }
  if (val != (char **)0x0) {
    *val = (obj->value)._M_dataplus._M_p;
    return 0;
  }
  return 0x3e9;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageGetValue(hrgls_Message obj, const char **val)
  {
	  hrgls_Status s = hrgls_STATUS_OKAY;
	  if (!obj) {
		  return hrgls_STATUS_NULL_OBJECT_POINTER;
	  }
	  if (!val) {
		  return hrgls_STATUS_BAD_PARAMETER;
	  }

	  *val = obj->value.c_str();
	  return s;
  }